

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,StoreInst *i)

{
  __single_object ins;
  _Head_base<0UL,_arm::LoadStoreInst_*,_false> local_78;
  undefined1 local_70 [8];
  MemoryOperand local_68;
  VarId local_38;
  
  local_70._4_4_ = 0x1c;
  local_70._0_4_ = translate_value_to_reg(this,&i->val);
  local_38.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_38.id = (i->super_Inst).dest.id;
  translate_var_to_memory_arg(&local_68,this,&local_38);
  std::make_unique<arm::LoadStoreInst,arm::OpCode,unsigned_int,arm::MemoryOperand>
            ((OpCode *)&local_78,(uint *)(local_70 + 4),(MemoryOperand *)local_70);
  local_68.super_Displayable._vptr_Displayable = (_func_int **)local_78._M_head_impl;
  local_78._M_head_impl = (LoadStoreInst *)0x0;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_68);
  if ((LoadStoreInst *)local_68.super_Displayable._vptr_Displayable != (LoadStoreInst *)0x0) {
    (**(code **)(*local_68.super_Displayable._vptr_Displayable + 0x10))();
  }
  std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
            ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)&local_78);
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::StoreInst& i) {
  auto ins = std::make_unique<LoadStoreInst>(
      arm::OpCode::StR, translate_value_to_reg(i.val),
      translate_var_to_memory_arg(i.dest));
  inst.push_back(std::move(ins));
}